

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_compare.c
# Opt level: O0

void print_usage(char *progname)

{
  char *progname_local;
  
  fprintf(_stderr,"Usage: %s [-pa] version1 [op] version2\n",progname);
  fprintf(_stderr,"\n");
  fprintf(_stderr," op       - if specified (supports <, <=, =, >=, >, lt, le, eq, ge, gt),\n");
  fprintf(_stderr,"            the utility would exit with zero (success) status code if the\n");
  fprintf(_stderr,"            given condition is satisfied.  Otherwise, the utility would\n");
  fprintf(_stderr,"            print <, =, or > to indicate how specified versions compare.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr," -p       - \'p\' letter is treated as \'patch\' instead of \'pre\'\n");
  fprintf(_stderr," -a       - any alphabetic characters are treated as post-release\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr," -h, -?   - print usage and exit\n");
  fprintf(_stderr," -v       - print version and exit\n");
  return;
}

Assistant:

static void print_usage(const char* progname) {
	fprintf(stderr, "Usage: %s [-pa] version1 [op] version2\n", progname);
	fprintf(stderr, "\n");
	fprintf(stderr, " op       - if specified (supports <, <=, =, >=, >, lt, le, eq, ge, gt),\n");
	fprintf(stderr, "            the utility would exit with zero (success) status code if the\n");
	fprintf(stderr, "            given condition is satisfied.  Otherwise, the utility would\n");
	fprintf(stderr, "            print <, =, or > to indicate how specified versions compare.\n");
	fprintf(stderr, "\n");
	fprintf(stderr, " -p       - 'p' letter is treated as 'patch' instead of 'pre'\n");
	fprintf(stderr, " -a       - any alphabetic characters are treated as post-release\n");
	fprintf(stderr, "\n");
	fprintf(stderr, " -h, -?   - print usage and exit\n");
	fprintf(stderr, " -v       - print version and exit\n");
}